

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O1

void codearith(FuncState *fs,OpCode op,expdesc *e1,expdesc *e2,int line)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  lua_Number lVar4;
  
  if ((((((e1->k == VKNUM) && (e1->t == -1)) && (e1->f == -1)) &&
       ((e2->k == VKNUM && (e2->t == -1)))) && (e2->f == -1)) &&
     ((((op & ~OP_LOADK) != OP_DIV || ((e2->u).nval != 0.0)) || (NAN((e2->u).nval))))) {
    lVar4 = luaO_arith(op - OP_ADD,(e1->u).nval,(e2->u).nval);
    (e1->u).nval = lVar4;
    return;
  }
  iVar1 = 0;
  if ((op != OP_UNM) && (iVar1 = 0, op != OP_LEN)) {
    iVar1 = luaK_exp2RK(fs,e2);
  }
  iVar2 = luaK_exp2RK(fs,e1);
  if (iVar1 < iVar2) {
    if (((e1->k == VNONRELOC) && (((uint)(e1->u).info >> 8 & 1) == 0)) &&
       ((int)(uint)fs->nactvar <= (e1->u).info)) {
      fs->freereg = fs->freereg + 0xff;
    }
    if (e2->k != VNONRELOC) goto LAB_00106f6a;
    uVar3 = (e2->u).info;
  }
  else {
    if (((e2->k == VNONRELOC) && (((uint)(e2->u).info >> 8 & 1) == 0)) &&
       ((int)(uint)fs->nactvar <= (e2->u).info)) {
      fs->freereg = fs->freereg + 0xff;
    }
    if (e1->k != VNONRELOC) goto LAB_00106f6a;
    uVar3 = (e1->u).info;
  }
  if (((uVar3 >> 8 & 1) == 0) && ((int)(uint)fs->nactvar <= (int)uVar3)) {
    fs->freereg = fs->freereg + 0xff;
  }
LAB_00106f6a:
  iVar1 = luaK_code(fs,iVar1 << 0xe | iVar2 << 0x17 | op);
  (e1->u).info = iVar1;
  e1->k = VRELOCABLE;
  fs->f->lineinfo[(long)fs->pc + -1] = line;
  return;
}

Assistant:

static void codearith (FuncState *fs, OpCode op,
                       expdesc *e1, expdesc *e2, int line) {
  if (constfolding(op, e1, e2))
    return;
  else {
    int o2 = (op != OP_UNM && op != OP_LEN) ? luaK_exp2RK(fs, e2) : 0;
    int o1 = luaK_exp2RK(fs, e1);
    if (o1 > o2) {
      freeexp(fs, e1);
      freeexp(fs, e2);
    }
    else {
      freeexp(fs, e2);
      freeexp(fs, e1);
    }
    e1->u.info = luaK_codeABC(fs, op, 0, o1, o2);
    e1->k = VRELOCABLE;
    luaK_fixline(fs, line);
  }
}